

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  uint _h;
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  size_t sVar5;
  void *pvVar6;
  int _w;
  Layer *pLVar7;
  void *pvVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  long lVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  ulong uVar14;
  ParamDict pd;
  size_t local_50;
  int local_34;
  
  pLVar7 = create_layer(0xe);
  this->flatten = pLVar7;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  p_Var3 = this->_vptr_InnerProduct_x86[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x140 + (long)p_Var3) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    _h = *(uint *)(p_Var3 + 0x28 + (long)&(this->weight_data_int8).data);
    iVar1 = *(int *)(p_Var3 + 0x30 + (long)&(this->weight_data_int8).data);
    if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
      _w = (int)((long)iVar1 / (long)(int)_h);
      uVar14 = 0;
      Mat::reshape((Mat *)&pd,(Mat *)(p_Var3 + 0x40 + (long)&(this->scales_in).data),_w,_h,
                   (Allocator *)0x0);
      Mat::create(&this->weight_data_packed,_w,
                  *(int *)(this->_vptr_InnerProduct_x86[-3] + 0x28 +
                          (long)&(this->weight_data_int8).data) / 4,0x10,4,(Allocator *)0x0);
      pp_Var4 = this->_vptr_InnerProduct_x86;
      iVar2 = (this->weight_data_packed).w;
      sVar5 = (this->weight_data_packed).elemsize;
      pvVar6 = (this->weight_data_packed).data;
      uVar13 = (long)iVar1 / (long)(int)_h & 0xffffffff;
      if (_w < 1) {
        uVar13 = uVar14;
      }
      for (; (long)(uVar14 | 3) <
             (long)*(int *)(pp_Var4[-3] + 0x28 + (long)&(this->weight_data_int8).data);
          uVar14 = uVar14 + 4) {
        pvVar8 = (void *)((uVar14 >> 2 & 0x3fffffff) * (long)iVar2 * sVar5 + (long)pvVar6);
        pp_Var9 = (_func_int **)((long)local_34 * local_50 * uVar14 + (long)pd._vptr_ParamDict);
        for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
          pp_Var12 = pp_Var9;
          for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
            *(undefined4 *)((long)pvVar8 + lVar11) = *(undefined4 *)pp_Var12;
            pp_Var12 = (_func_int **)((long)pp_Var12 + (long)local_34 * local_50);
          }
          pp_Var9 = (_func_int **)((long)pp_Var9 + 4);
          pvVar8 = (void *)((long)pvVar8 + 0x10);
        }
      }
      Mat::~Mat((Mat *)&pd);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}